

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,FunctionStatement *func_stmt,void *data)

{
  SyntaxTree *pSVar1;
  FunctionNameData name_data;
  char local_19;
  
  local_19 = '\0';
  pSVar1 = (func_stmt->func_name_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_19);
  pSVar1 = (func_stmt->func_body_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (local_19 == '\x01') {
    *(undefined1 *)&pSVar1[3]._vptr_SyntaxTree = 1;
  }
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(FunctionStatement *func_stmt, void *data)
    {
        FunctionNameData name_data;
        func_stmt->func_name_->Accept(this, &name_data);

        // Set FunctionBody has 'self' param when FunctionName has member token
        if (name_data.has_member_token_)
        {
            auto body = static_cast<FunctionBody *>(func_stmt->func_body_.get());
            body->has_self_ = true;
        }

        func_stmt->func_body_->Accept(this, nullptr);
    }